

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap.c
# Opt level: O3

map_t * remap_init(uint32 n_hashed)

{
  uint uVar1;
  undefined1 auVar2 [16];
  map_t *pmVar3;
  mapping_t *pmVar4;
  uint32 *puVar5;
  uint uVar6;
  uint32 l;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  double dVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  ulong uVar10;
  long lVar15;
  
  uVar1 = n_hashed * 3;
  uVar8 = (ulong)uVar1;
  do {
    uVar7 = (uint)uVar8;
    dVar11 = ceil(SQRT((double)uVar8));
    uVar10 = 2;
    uVar9 = 2;
    uVar6 = (uint)(long)dVar11;
    if (2 < uVar6) {
      while (uVar9 = (uint)uVar10, (int)(uVar8 % uVar10) != 0) {
        uVar10 = (ulong)(uVar9 + 1);
        if (uVar6 == uVar9 + 1) goto LAB_00129cbd;
      }
      uVar8 = (ulong)(uVar7 + 1);
    }
    uVar7 = (uint)uVar8;
    if (uVar9 == uVar6) goto LAB_00129cbd;
  } while (uVar7 != uVar1);
  fprintf(_stderr,"next_prime: failed to find next prime for %d\n",(ulong)uVar1);
  uVar7 = uVar1;
LAB_00129cbd:
  pmVar3 = (map_t *)__ckd_calloc__(1,0x20,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                                   ,0x62);
  uVar8 = (ulong)uVar7;
  pmVar4 = (mapping_t *)
           __ckd_calloc__(uVar8,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                          ,100);
  pmVar3->map = pmVar4;
  puVar5 = (uint32 *)
           __ckd_calloc__((ulong)n_hashed,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                          ,0x65);
  pmVar3->inv = puVar5;
  pmVar3->n_map = uVar7;
  auVar2 = _DAT_00136da0;
  if (uVar7 != 0) {
    pmVar4 = pmVar3->map;
    lVar15 = uVar8 - 1;
    auVar12._8_4_ = (int)lVar15;
    auVar12._0_8_ = lVar15;
    auVar12._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar10 = 0;
    auVar12 = auVar12 ^ _DAT_00136da0;
    auVar14 = _DAT_0013a810;
    auVar16 = _DAT_00136d90;
    do {
      auVar17 = auVar16 ^ auVar2;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar17._4_4_ == iVar13 && auVar12._0_4_ < auVar17._0_4_ ||
                  iVar13 < auVar17._4_4_) & 1)) {
        *(undefined4 *)((long)&pmVar4->x + uVar10) = 0xffffffff;
      }
      if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
          auVar17._12_4_ <= auVar12._12_4_) {
        *(undefined4 *)((long)&pmVar4[1].x + uVar10) = 0xffffffff;
      }
      auVar17 = auVar14 ^ auVar2;
      iVar18 = auVar17._4_4_;
      if (iVar18 <= iVar13 && (iVar18 != iVar13 || auVar17._0_4_ <= auVar12._0_4_)) {
        *(undefined4 *)((long)&pmVar4[2].x + uVar10) = 0xffffffff;
        *(undefined4 *)((long)&pmVar4[3].x + uVar10) = 0xffffffff;
      }
      lVar15 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar15 + 4;
      lVar15 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar15 + 4;
      uVar10 = uVar10 + 0x20;
    } while ((uVar8 * 8 + 0x18 & 0xffffffffffffffe0) != uVar10);
  }
  return pmVar3;
}

Assistant:

map_t *
remap_init(uint32 n_hashed)
{
    map_t *new;
    unsigned int i;
    uint32 size;

    size = next_prime(n_hashed * 3);

    new = ckd_calloc(1, sizeof(map_t));

    new->map = ckd_calloc(size, sizeof(mapping_t));
    new->inv = ckd_calloc(n_hashed, sizeof(uint32));
    new->n_map = size;

    for (i = 0; i < size; i++) {
	new->map[i].x = FREE_MAPPING;
    }

    return new;
}